

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O1

int FreeEXRImage(EXRImage *exr_image)

{
  uchar *puVar1;
  uchar **ppuVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  
  if (exr_image == (EXRImage *)0x0) {
    iVar3 = -3;
  }
  else {
    if (exr_image->next_level != (EXRImage *)0x0) {
      FreeEXRImage(exr_image->next_level);
      if (exr_image->next_level != (TEXRImage *)0x0) {
        operator_delete(exr_image->next_level);
      }
    }
    if (0 < exr_image->num_channels) {
      lVar5 = 0;
      do {
        if ((exr_image->images != (uchar **)0x0) &&
           (puVar1 = exr_image->images[lVar5], puVar1 != (uchar *)0x0)) {
          free(puVar1);
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 < exr_image->num_channels);
    }
    if (exr_image->images != (uchar **)0x0) {
      free(exr_image->images);
    }
    iVar3 = 0;
    if (exr_image->tiles != (EXRTile *)0x0) {
      if (0 < exr_image->num_tiles) {
        lVar5 = 0;
        do {
          if (0 < exr_image->num_channels) {
            lVar4 = 0;
            do {
              ppuVar2 = exr_image->tiles[lVar5].images;
              if ((ppuVar2 != (uchar **)0x0) && (puVar1 = ppuVar2[lVar4], puVar1 != (uchar *)0x0)) {
                free(puVar1);
              }
              lVar4 = lVar4 + 1;
            } while (lVar4 < exr_image->num_channels);
          }
          ppuVar2 = exr_image->tiles[lVar5].images;
          if (ppuVar2 != (uchar **)0x0) {
            free(ppuVar2);
          }
          lVar5 = lVar5 + 1;
        } while (lVar5 < exr_image->num_tiles);
      }
      free(exr_image->tiles);
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

int FreeEXRImage(EXRImage *exr_image) {
  if (exr_image == NULL) {
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

  if (exr_image->next_level) {
    FreeEXRImage(exr_image->next_level);
    delete exr_image->next_level;
  }

  for (int i = 0; i < exr_image->num_channels; i++) {
    if (exr_image->images && exr_image->images[i]) {
      free(exr_image->images[i]);
    }
  }

  if (exr_image->images) {
    free(exr_image->images);
  }

  if (exr_image->tiles) {
    for (int tid = 0; tid < exr_image->num_tiles; tid++) {
      for (int i = 0; i < exr_image->num_channels; i++) {
        if (exr_image->tiles[tid].images && exr_image->tiles[tid].images[i]) {
          free(exr_image->tiles[tid].images[i]);
        }
      }
      if (exr_image->tiles[tid].images) {
        free(exr_image->tiles[tid].images);
      }
    }
    free(exr_image->tiles);
  }

  return TINYEXR_SUCCESS;
}